

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *in_RSI;
  ImGuiID in_EDI;
  ImGuiNavLayer nav_layer;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImRect local_2c;
  ImGuiNavLayer local_1c;
  ImGuiContext *local_18;
  ImGuiWindow *local_10;
  
  pIVar1 = GImGui;
  local_18 = GImGui;
  local_1c = (in_RSI->DC).NavLayerCurrent;
  if (GImGui->NavWindow != in_RSI) {
    GImGui->NavInitRequest = false;
  }
  pIVar1->NavWindow = in_RSI;
  pIVar1->NavId = in_EDI;
  pIVar1->NavLayer = local_1c;
  pIVar1->NavFocusScopeId = (in_RSI->DC).NavFocusScopeIdCurrent;
  in_RSI->NavLastIds[local_1c] = in_EDI;
  if ((in_RSI->DC).LastItemId == in_EDI) {
    local_10 = in_RSI;
    local_34 = operator-(in_stack_ffffffffffffffb8,(ImVec2 *)0x145cdc);
    local_3c = operator-(in_stack_ffffffffffffffb8,(ImVec2 *)0x145cfa);
    ImRect::ImRect(&local_2c,&local_34,&local_3c);
    local_10->NavRectRel[local_1c].Min = local_2c.Min;
    (&local_10->NavRectRel[local_1c].Min)[1] = local_2c.Max;
  }
  if (local_18->ActiveIdSource == ImGuiInputSource_Nav) {
    local_18->NavDisableMouseHover = true;
  }
  else {
    local_18->NavDisableHighlight = true;
  }
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}